

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *g;
  float fVar7;
  float fVar8;
  ImVec2 ref_pos;
  ImRect r_avoid;
  ImRect r_outer;
  ImVec2 local_48;
  float local_3c;
  ImRect local_38;
  ImRect local_20;
  
  pIVar6 = GImGui;
  fVar8 = (GImGui->Style).DisplaySafeAreaPadding.x;
  fVar7 = (GImGui->Style).DisplaySafeAreaPadding.y;
  fVar1 = (GImGui->IO).DisplaySize.x;
  fVar2 = (GImGui->IO).DisplaySize.y;
  local_20.Max.x = (float)(-(uint)(fVar8 + fVar8 < fVar1) & (uint)-fVar8);
  local_20.Max.y = (float)(-(uint)(fVar7 + fVar7 < fVar2) & (uint)-fVar7);
  local_20.Min.x = 0.0 - local_20.Max.x;
  local_20.Min.y = 0.0 - local_20.Max.y;
  local_20.Max.x = local_20.Max.x + fVar1;
  local_20.Max.y = local_20.Max.y + fVar2;
  uVar3 = window->Flags;
  if ((uVar3 >> 0x1c & 1) == 0) {
    if ((uVar3 >> 0x1a & 1) == 0) {
      if ((uVar3 >> 0x19 & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                      ,0x1eeb,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      local_3c = (GImGui->Style).MouseCursorScale;
      local_48 = NavCalcPreferredRefPos();
      if (((pIVar6->NavDisableHighlight == false) && (pIVar6->NavDisableMouseHover == true)) &&
         (((pIVar6->IO).ConfigFlags & 4) == 0)) {
        local_38.Max.x = local_48.x + 16.0;
        fVar8 = 8.0;
      }
      else {
        fVar8 = local_3c * 24.0;
        local_38.Max.x = fVar8 + local_48.x;
      }
      local_38.Min.y = local_48.y + -8.0;
      local_38.Min.x = local_48.x + -16.0;
      local_38.Max.y = fVar8 + local_48.y;
      IVar5 = FindBestWindowPosForPopupEx
                        (&local_48,&window->Size,&window->AutoPosLastDirection,&local_20,&local_38,
                         ImGuiPopupPositionPolicy_Default);
      fVar8 = IVar5.x;
      fVar7 = IVar5.y;
      if (window->AutoPosLastDirection == -1) {
        fVar8 = local_48.x + 2.0;
        fVar7 = local_48.y + 2.0;
      }
      goto LAB_0015e0a3;
    }
    fVar8 = (window->Pos).x;
    fVar7 = (window->Pos).y;
    local_38.Min.y = fVar7 + -1.0;
    local_38.Min.x = fVar8 + -1.0;
    local_38.Max.y = fVar7 + 1.0;
    local_38.Max.x = fVar8 + 1.0;
  }
  else {
    if (GImGui->CurrentWindow != window) {
      __assert_fail("g.CurrentWindow == window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x1ecd,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
    }
    pIVar4 = (GImGui->CurrentWindowStack).Data[(long)(GImGui->CurrentWindowStack).Size + -2];
    fVar8 = (GImGui->Style).ItemInnerSpacing.x;
    if ((pIVar4->DC).MenuBarAppending == true) {
      local_38.Min.y = (pIVar4->ClipRect).Min.y;
      local_38.Max.y = (pIVar4->ClipRect).Max.y;
      local_38.Max.x = 3.4028235e+38;
      local_38.Min.x = -3.4028235e+38;
    }
    else {
      fVar7 = (pIVar4->Pos).x;
      local_38.Min.x = fVar8 + fVar7;
      local_38.Max.x = ((fVar7 + (pIVar4->Size).x) - fVar8) - (pIVar4->ScrollbarSizes).x;
      local_38.Max.y = 3.4028235e+38;
      local_38.Min.y = -3.4028235e+38;
    }
  }
  IVar5 = FindBestWindowPosForPopupEx
                    (&window->Pos,&window->Size,&window->AutoPosLastDirection,&local_20,&local_38,
                     ImGuiPopupPositionPolicy_Default);
  fVar8 = IVar5.x;
  fVar7 = IVar5.y;
LAB_0015e0a3:
  IVar5.y = fVar7;
  IVar5.x = fVar8;
  return IVar5;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}